

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_simd.h
# Opt level: O0

void initializeFuncs(void)

{
  int *unaff_retaddr;
  int *in_stack_00000008;
  int sse2;
  int avx;
  int f16c;
  
  if (initializeFuncs::done == 0) {
    initializeFuncs::done = 1;
    convertFloatToHalf64 = convertFloatToHalf64_scalar;
    fromHalfZigZag = fromHalfZigZag_scalar;
    check_for_x86_simd(_avx,in_stack_00000008,unaff_retaddr);
    dctInverse8x8_7 = dctInverse8x8_scalar_7;
    dctInverse8x8_6 = dctInverse8x8_scalar_6;
    dctInverse8x8_5 = dctInverse8x8_scalar_5;
    dctInverse8x8_4 = dctInverse8x8_scalar_4;
    dctInverse8x8_3 = dctInverse8x8_scalar_3;
    dctInverse8x8_2 = dctInverse8x8_scalar_2;
    dctInverse8x8_1 = dctInverse8x8_scalar_1;
    dctInverse8x8_0 = dctInverse8x8_scalar_0;
  }
  return;
}

Assistant:

static void
initializeFuncs (void)
{
    static int done = 0;
    int        f16c = 0, avx = 0, sse2 = 0;
    if (done) return;
    done = 1;

#ifdef IMF_HAVE_NEON_AARCH64
    {
        convertFloatToHalf64 = convertFloatToHalf64_neon;
        fromHalfZigZag       = fromHalfZigZag_neon;
    }
#else
    convertFloatToHalf64 = convertFloatToHalf64_scalar;
    fromHalfZigZag       = fromHalfZigZag_scalar;

    check_for_x86_simd (&f16c, &avx, &sse2);

    //
    // Setup HALF <-> FLOAT conversion implementations
    //

    if (avx && f16c)
    {
        convertFloatToHalf64 = convertFloatToHalf64_f16c;
        fromHalfZigZag       = fromHalfZigZag_f16c;
    }

    dctInverse8x8_0 = dctInverse8x8_scalar_0;
    dctInverse8x8_1 = dctInverse8x8_scalar_1;
    dctInverse8x8_2 = dctInverse8x8_scalar_2;
    dctInverse8x8_3 = dctInverse8x8_scalar_3;
    dctInverse8x8_4 = dctInverse8x8_scalar_4;
    dctInverse8x8_5 = dctInverse8x8_scalar_5;
    dctInverse8x8_6 = dctInverse8x8_scalar_6;
    dctInverse8x8_7 = dctInverse8x8_scalar_7;
    if (avx)
    {
        dctInverse8x8_0 = dctInverse8x8_avx_0;
        dctInverse8x8_1 = dctInverse8x8_avx_1;
        dctInverse8x8_2 = dctInverse8x8_avx_2;
        dctInverse8x8_3 = dctInverse8x8_avx_3;
        dctInverse8x8_4 = dctInverse8x8_avx_4;
        dctInverse8x8_5 = dctInverse8x8_avx_5;
        dctInverse8x8_6 = dctInverse8x8_avx_6;
        dctInverse8x8_7 = dctInverse8x8_avx_7;
    }
    else if (sse2)
    {
        dctInverse8x8_0 = dctInverse8x8_sse2_0;
        dctInverse8x8_1 = dctInverse8x8_sse2_1;
        dctInverse8x8_2 = dctInverse8x8_sse2_2;
        dctInverse8x8_3 = dctInverse8x8_sse2_3;
        dctInverse8x8_4 = dctInverse8x8_sse2_4;
        dctInverse8x8_5 = dctInverse8x8_sse2_5;
        dctInverse8x8_6 = dctInverse8x8_sse2_6;
        dctInverse8x8_7 = dctInverse8x8_sse2_7;
    }
#endif
}